

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

U32 ZSTD_btGetAllMatches_extDict_4
              (ZSTD_match_t *matches,ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip,
              BYTE *iHighLimit,U32 *rep,U32 ll0,U32 lengthToBeat)

{
  ulong *puVar1;
  ulong *puVar2;
  BYTE *__s1;
  uint uVar3;
  BYTE *pBVar4;
  long lVar5;
  U32 lowestValid;
  U32 UVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  uint *puVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  ulong *puVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  BYTE *__s1_00;
  BYTE *pInLoopLimit;
  uint *local_100;
  uint local_f8;
  uint *local_d0;
  ulong local_c8;
  uint local_7c;
  ZSTD_matchState_t *local_78;
  ulong *local_70;
  ulong *local_68;
  BYTE *local_60;
  BYTE *local_58;
  BYTE *local_50;
  ZSTD_match_t *local_48;
  U32 *local_40;
  U32 *local_38;
  
  local_48 = matches;
  if ((ms->cParams).minMatch != 4) {
    __assert_fail("BOUNDED(3, ms->cParams.minMatch, 6) == mls",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8263,
                  "U32 ZSTD_btGetAllMatches_internal(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *, const BYTE *const, const U32 *, const U32, const U32, const ZSTD_dictMode_e, const U32)"
                 );
  }
  pBVar4 = (ms->window).base;
  uVar30 = (ulong)ms->nextToUpdate;
  UVar6 = 0;
  if (pBVar4 + uVar30 <= ip) {
    local_78 = ms;
    while( true ) {
      uVar31 = (uint)uVar30;
      uVar7 = (uint)((long)ip - (long)pBVar4);
      if (uVar7 <= uVar31) break;
      UVar6 = ZSTD_insertBt1(ms,pBVar4 + uVar30,iHighLimit,uVar7,4,1);
      uVar30 = (ulong)(UVar6 + uVar31);
      if (UVar6 + uVar31 <= uVar31) {
        __assert_fail("idx < (U32)(idx + forward)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x815a,
                      "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                     );
      }
    }
    if ((ulong)((long)ip - (long)pBVar4) >> 0x20 != 0) {
      __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x815d,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    if ((ulong)((long)iHighLimit - (long)pBVar4) >> 0x20 != 0) {
      __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x815e,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    ms->nextToUpdate = uVar7;
    uVar7 = (ms->cParams).targetLength;
    uVar31 = 0xfff;
    if (uVar7 < 0xfff) {
      uVar31 = uVar7;
    }
    uVar7 = (ms->cParams).hashLog;
    if (0x20 < uVar7) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    uVar27 = (uint)(*(int *)ip * -0x61c8864f) >> (-(char)uVar7 & 0x1fU);
    pBVar4 = (ms->window).base;
    uVar26 = (int)ip - (int)pBVar4;
    uVar24 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    uVar30 = 0;
    uVar7 = uVar26 - uVar24;
    if (uVar26 < uVar24) {
      uVar7 = 0;
    }
    uVar8 = (ms->window).lowLimit;
    uVar19 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar23 = uVar26 - uVar19;
    if (uVar26 - uVar8 <= uVar19) {
      uVar23 = uVar8;
    }
    if (ms->loadedDictEnd != 0) {
      uVar23 = uVar8;
    }
    uVar8 = uVar23 + (uVar23 == 0);
    uVar19 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    if (1 < ll0) {
      __assert_fail("ll0 <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x819e,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    local_40 = ms->hashTable;
    uVar25 = local_40[uVar27];
    local_38 = ms->chainTable;
    local_50 = (ms->window).dictBase;
    uVar3 = (ms->window).dictLimit;
    uVar28 = (ulong)uVar3;
    local_58 = local_50 + uVar28;
    local_60 = pBVar4 + uVar28;
    uVar10 = (ulong)((uVar24 & uVar26) * 2);
    local_d0 = local_38 + uVar10;
    local_100 = local_38 + uVar10 + 1;
    local_f8 = uVar26 + 9;
    uVar10 = (ulong)(lengthToBeat - 1);
    puVar1 = (ulong *)(ip + 4);
    puVar2 = (ulong *)(iHighLimit + -7);
    local_68 = (ulong *)(iHighLimit + -3);
    local_70 = (ulong *)(iHighLimit + -1);
    uVar29 = (ulong)ll0;
    do {
      if (uVar29 == 3) {
        uVar17 = *rep - 1;
      }
      else {
        uVar17 = rep[uVar29];
      }
      if (uVar26 < uVar3) {
        __assert_fail("curr >= dictLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81a5,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      uVar20 = uVar26 - uVar17;
      if (uVar17 - 1 < uVar26 - uVar3) {
        uVar13 = 0;
        if ((uVar23 <= uVar20) && (*(int *)ip == *(int *)(ip + -(ulong)uVar17))) {
          lVar21 = -(ulong)uVar17;
          puVar22 = (ulong *)((long)puVar1 + lVar21);
          puVar15 = puVar1;
          if (puVar1 < puVar2) {
            if (*puVar22 == *puVar1) {
              lVar21 = lVar21 + 0xc;
              lVar18 = 0;
              do {
                puVar15 = (ulong *)(ip + lVar18 + 0xc);
                if (puVar2 <= puVar15) {
                  puVar22 = (ulong *)(ip + lVar18 + lVar21);
                  goto LAB_001cd34f;
                }
                lVar5 = lVar18 + lVar21;
                lVar18 = lVar18 + 8;
              } while (*(ulong *)(ip + lVar5) == *puVar15);
              uVar11 = *puVar15 ^ *(ulong *)(ip + lVar5);
              uVar13 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar17 = ((uint)(uVar13 >> 3) & 0x1fffffff) + (int)lVar18;
            }
            else {
              uVar11 = *puVar1 ^ *puVar22;
              uVar13 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar17 = (uint)(uVar13 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_001cd34f:
            if ((puVar15 < local_68) && ((int)*puVar22 == (int)*puVar15)) {
              puVar15 = (ulong *)((long)puVar15 + 4);
              puVar22 = (ulong *)((long)puVar22 + 4);
            }
            if ((puVar15 < local_70) && ((short)*puVar22 == (short)*puVar15)) {
              puVar15 = (ulong *)((long)puVar15 + 2);
              puVar22 = (ulong *)((long)puVar22 + 2);
            }
            if (puVar15 < iHighLimit) {
              puVar15 = (ulong *)((long)puVar15 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar15));
            }
            uVar17 = (int)puVar15 - (int)puVar1;
          }
LAB_001cd397:
          uVar13 = (ulong)(uVar17 + 4);
        }
      }
      else {
        if (uVar26 < uVar23) {
          __assert_fail("curr >= windowLow",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x81b1,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        uVar13 = 0;
        if (((uVar17 - 1 < uVar26 - uVar23) && (uVar20 - uVar3 < 0xfffffffd)) &&
           (*(int *)ip == *(int *)(local_50 + uVar20))) {
          sVar12 = ZSTD_count_2segments
                             ((BYTE *)puVar1,(BYTE *)((long)(local_50 + uVar20) + 4),iHighLimit,
                              local_58,local_60);
          uVar17 = (uint)sVar12;
          goto LAB_001cd397;
        }
      }
      if (uVar10 < uVar13) {
        local_48[uVar30].off = ((int)uVar29 - ll0) + 1;
        local_48[uVar30].len = (uint)uVar13;
        uVar17 = (int)uVar30 + 1;
        uVar30 = (ulong)uVar17;
        if (uVar31 < (uint)uVar13) {
          return uVar17;
        }
        uVar10 = uVar13;
        if (ip + uVar13 == iHighLimit) {
          return uVar17;
        }
      }
      UVar6 = (U32)uVar30;
      uVar29 = uVar29 + 1;
    } while (ll0 + 3 != (int)uVar29);
    local_40[uVar27] = uVar26;
    if (uVar8 <= uVar25) {
      local_c8 = 0;
      uVar29 = 0;
      do {
        uVar13 = uVar29;
        if (local_c8 < uVar29) {
          uVar13 = local_c8;
        }
        if (uVar26 <= uVar25) {
          __assert_fail("curr > matchIndex",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x81f1,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        uVar14 = (ulong)uVar25;
        uVar11 = uVar14 + uVar13;
        if (uVar11 < uVar28) {
          __s1 = local_50 + uVar14;
          iVar9 = bcmp(__s1,ip,uVar13);
          if (iVar9 != 0) {
            __assert_fail("memcmp(match, ip, matchLength) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x81fa,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          sVar12 = ZSTD_count_2segments(ip + uVar13,__s1 + uVar13,iHighLimit,local_58,local_60);
          uVar13 = sVar12 + uVar13;
          __s1_00 = pBVar4 + uVar14;
          if (uVar13 + uVar14 < uVar28) {
            __s1_00 = __s1;
          }
        }
        else {
          __s1_00 = pBVar4 + uVar14;
          if ((uVar3 <= uVar25) && (iVar9 = bcmp(__s1_00,ip,uVar13), iVar9 != 0)) {
            __assert_fail("memcmp(match, ip, matchLength) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x81f6,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          puVar1 = (ulong *)(ip + uVar13);
          puVar22 = (ulong *)(__s1_00 + uVar13);
          puVar15 = puVar1;
          if (puVar1 < puVar2) {
            if (*puVar22 == *puVar1) {
              lVar21 = 0;
              do {
                puVar15 = (ulong *)(ip + lVar21 + uVar13 + 8);
                if (puVar2 <= puVar15) {
                  puVar22 = (ulong *)(pBVar4 + uVar11 + lVar21 + 8);
                  goto LAB_001cd610;
                }
                lVar18 = lVar21 + uVar11 + 8;
                lVar21 = lVar21 + 8;
              } while (*(ulong *)(pBVar4 + lVar18) == *puVar15);
              uVar14 = *puVar15 ^ *(ulong *)(pBVar4 + lVar18);
              uVar11 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                }
              }
              uVar11 = (uVar11 >> 3 & 0x1fffffff) + lVar21;
            }
            else {
              uVar14 = *puVar1 ^ *puVar22;
              uVar11 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                }
              }
              uVar11 = uVar11 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001cd610:
            if ((puVar15 < local_68) && ((int)*puVar22 == (int)*puVar15)) {
              puVar15 = (ulong *)((long)puVar15 + 4);
              puVar22 = (ulong *)((long)puVar22 + 4);
            }
            if ((puVar15 < local_70) && ((short)*puVar22 == (short)*puVar15)) {
              puVar15 = (ulong *)((long)puVar15 + 2);
              puVar22 = (ulong *)((long)puVar22 + 2);
            }
            if (puVar15 < iHighLimit) {
              puVar15 = (ulong *)((long)puVar15 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar15));
            }
            uVar11 = (long)puVar15 - (long)puVar1;
          }
          uVar13 = uVar11 + uVar13;
        }
        if (uVar10 < uVar13) {
          if (local_f8 < uVar25 || local_f8 - uVar25 == 0) {
            __assert_fail("matchEndIdx > matchIndex",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8203,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          if (local_f8 - uVar25 < uVar13) {
            local_f8 = uVar25 + (U32)uVar13;
          }
          local_48[uVar30].off = (uVar26 + 3) - uVar25;
          local_48[uVar30].len = (U32)uVar13;
          UVar6 = (int)uVar30 + 1;
          uVar30 = (ulong)UVar6;
          if ((0x1000 < uVar13) || (uVar10 = uVar13, ip + uVar13 == iHighLimit)) break;
        }
        UVar6 = (U32)uVar30;
        puVar16 = local_38 + (uVar25 & uVar24) * 2;
        if (__s1_00[uVar13] < ip[uVar13]) {
          *local_d0 = uVar25;
          if (uVar25 <= uVar7) {
            local_d0 = &local_7c;
            break;
          }
          puVar16 = puVar16 + 1;
          local_d0 = puVar16;
          local_c8 = uVar13;
        }
        else {
          *local_100 = uVar25;
          local_100 = puVar16;
          uVar29 = uVar13;
          if (uVar25 <= uVar7) {
            local_100 = &local_7c;
            break;
          }
        }
        uVar19 = uVar19 - 1;
        if ((uVar19 == 0) || (uVar25 = *puVar16, uVar25 < uVar8)) break;
      } while( true );
    }
    *local_100 = 0;
    *local_d0 = 0;
    if (0x40000000 < uVar19) {
      __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8221,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if (local_f8 <= uVar26 + 8) {
      __assert_fail("matchEndIdx > curr+8",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8248,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    local_78->nextToUpdate = local_f8 - 8;
  }
  return UVar6;
}

Assistant:

GEN_ZSTD_BT_GET_ALL_MATCHES(noDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(extDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(dictMatchState)

#define ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMode)  \
    {                                            \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 3), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 4), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 5), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 6)  \
    }

static ZSTD_getAllMatchesFn
ZSTD_selectBtGetAllMatches(ZSTD_matchState_t const* ms, ZSTD_dictMode_e const dictMode)
{
    ZSTD_getAllMatchesFn const getAllMatchesFns[3][4] = {
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(noDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(extDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMatchState)
    };
    U32 const mls = BOUNDED(3, ms->cParams.minMatch, 6);
    assert((U32)dictMode < 3);
    assert(mls - 3 < 4);
    return getAllMatchesFns[(int)dictMode][mls - 3];
}

/*************************
*  LDM helper functions  *
*************************/

/* Struct containing info needed to make decision about ldm inclusion */
typedef struct {
    rawSeqStore_t seqStore;   /* External match candidates store for this block */
    U32 startPosInBlock;      /* Start position of the current match candidate */
    U32 endPosInBlock;        /* End position of the current match candidate */
    U32 offset;               /* Offset of the match candidate */
} ZSTD_optLdm_t;

/* ZSTD_optLdm_skipRawSeqStoreBytes():
 * Moves forward in @rawSeqStore by @nbBytes,
 * which will update the fields 'pos' and 'posInSequence'.
 */
static void ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes)
{
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}